

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

shared_ptr<kratos::Var> __thiscall
kratos::EnableStmtVisitor::get_cond(EnableStmtVisitor *this,Stmt *stmt)

{
  size_type *psVar1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar2;
  Var *pVVar3;
  pointer ppVar4;
  Stmt *pSVar5;
  element_type *peVar6;
  element_type *peVar7;
  undefined1 auVar8 [8];
  int iVar9;
  undefined4 extraout_var;
  string *psVar10;
  _Rb_tree_node_base *p_Var11;
  ulong uVar12;
  Expr *pEVar13;
  StmtException *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __node_base this_01;
  bool bVar15;
  long lVar16;
  shared_ptr<kratos::Var> sVar17;
  initializer_list<kratos::IRNode_*> __l;
  Var *local_a0;
  undefined1 auStack_98 [8];
  shared_ptr<kratos::Var> or_;
  Var *local_78;
  element_type *peStack_70;
  allocator_type local_59;
  undefined1 auStack_58 [8];
  shared_ptr<kratos::Var> rest_expr;
  __node_base local_38;
  Stmt *stmt_00;
  
  iVar9 = (*(stmt->super_IRNode)._vptr_IRNode[4])(stmt);
  stmt_00 = (Stmt *)CONCAT44(extraout_var,iVar9);
  if ((stmt_00->super_IRNode).ast_node_type_ == GeneratorKind) {
    (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)0x0;
    *(undefined8 *)&(this->super_IRVisitor).level = 0;
    _Var14._M_pi = extraout_RDX;
    goto LAB_00227589;
  }
  if (stmt_00->type_ == Switch) {
    p_Var11 = (_Rb_tree_node_base *)stmt_00[1].super_IRNode.comment.field_2._M_allocated_capacity;
    psVar10 = &stmt_00[1].super_IRNode.comment;
    if (p_Var11 == (_Rb_tree_node_base *)psVar10) {
      local_38._M_nxt = (_Hash_node_base *)0x0;
      local_a0 = (Var *)0x0;
      bVar15 = false;
    }
    else {
      bVar15 = false;
      local_a0 = (Var *)0x0;
      this_01._M_nxt = (_Hash_node_base *)(element_type *)0x0;
      do {
        pSVar5 = (Stmt *)p_Var11[1]._M_left;
        local_38._M_nxt = this_01._M_nxt;
        if ((pSVar5 == stmt) && (bVar15 = true, *(long *)(p_Var11 + 1) != 0)) {
          pVVar3 = (Var *)stmt_00[1].super_IRNode._vptr_IRNode;
          ppVar4 = stmt_00[1].super_IRNode.fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (ppVar4 != (pointer)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              psVar1 = &(ppVar4->first)._M_string_length;
              *(int *)psVar1 = (int)*psVar1 + 1;
              UNLOCK();
            }
            else {
              psVar1 = &(ppVar4->first)._M_string_length;
              *(int *)psVar1 = (int)*psVar1 + 1;
            }
          }
          pEVar13 = Var::eq(pVVar3,*(Var **)(p_Var11 + 1));
          std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                    ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_58,
                     (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                     &(pEVar13->super_Var).super_enable_shared_from_this<kratos::Var>);
          local_a0 = (Var *)auStack_58;
          local_38._M_nxt =
               (_Hash_node_base *)
               rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auStack_58 = (undefined1  [8])0x0;
          rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          if ((element_type *)this_01._M_nxt != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01._M_nxt);
          }
          if (rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          if (ppVar4 != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppVar4);
          }
          bVar15 = true;
        }
      } while ((pSVar5 != stmt) &&
              (p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11),
              this_01._M_nxt = local_38._M_nxt, p_Var11 != (_Rb_tree_node_base *)psVar10));
    }
    if (!bVar15) {
      this_00 = (StmtException *)__cxa_allocate_exception(0x10);
      auStack_58 = (undefined1  [8])
                   &rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_58,"Incorrect statement block stage","");
      __l._M_len = 1;
      __l._M_array = (iterator)&local_78;
      local_78 = (Var *)stmt;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_98,__l,
                 &local_59);
      StmtException::StmtException
                (this_00,(string *)auStack_58,
                 (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_98);
      __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_a0 == (Var *)0x0) {
      auStack_98 = (undefined1  [8])0x0;
      or_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      auStack_58 = (undefined1  [8])0x0;
      rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ::reserve((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                 *)auStack_58,*(size_type *)&stmt_00[1].super_IRNode.ast_node_type_);
      p_Var11 = (_Rb_tree_node_base *)stmt_00[1].super_IRNode.comment.field_2._M_allocated_capacity;
      if (p_Var11 != (_Rb_tree_node_base *)psVar10) {
        do {
          if (*(long *)(p_Var11 + 1) != 0) {
            std::
            vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>::
            emplace_back<std::shared_ptr<kratos::Const>const&>
                      ((vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>
                        *)auStack_58,(shared_ptr<kratos::Const> *)(p_Var11 + 1));
          }
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != (_Rb_tree_node_base *)psVar10);
      }
      peVar6 = rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auVar8 = auStack_58;
      if (auStack_58 !=
          (undefined1  [8])
          rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
        uVar12 = (long)rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 - (long)auStack_58 >> 4;
        lVar16 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar16 == 0; lVar16 = lVar16 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::EnableStmtVisitor::get_cond(kratos::Stmt*)::_lambda(std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::Const>const&)_1_>>
                  (auStack_58,
                   rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   ((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::EnableStmtVisitor::get_cond(kratos::Stmt*)::_lambda(std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::Const>const&)_1_>>
                  (auVar8,peVar6);
      }
      auStack_98 = *(undefined1 (*) [8])auStack_58;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&or_,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)auStack_58 + 8));
      if ((0x10 < (ulong)((long)rest_expr.
                                super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
                         (long)auStack_58)) &&
         (0x10 < (ulong)((long)rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr - (long)auStack_58))) {
        uVar12 = 1;
        lVar16 = 0x10;
        do {
          pEVar13 = Var::operator||((Var *)auStack_98,*(Var **)((long)auStack_58 + lVar16));
          std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                    ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                     (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                     &(pEVar13->super_Var).super_enable_shared_from_this<kratos::Var>);
          peVar7 = peStack_70;
          auStack_98 = (undefined1  [8])local_78;
          peVar6 = or_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_78 = (Var *)0x0;
          peStack_70 = (element_type *)0x0;
          or_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
          if (peVar6 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6);
          }
          if (peStack_70 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_70);
          }
          uVar12 = uVar12 + 1;
          lVar16 = lVar16 + 0x10;
        } while (uVar12 < (ulong)((long)rest_expr.
                                        super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_ptr - (long)auStack_58 >> 4));
      }
      pVVar3 = (Var *)stmt_00[1].super_IRNode._vptr_IRNode;
      ppVar4 = stmt_00[1].super_IRNode.fn_name_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (ppVar4 != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          psVar1 = &(ppVar4->first)._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
          UNLOCK();
        }
        else {
          psVar1 = &(ppVar4->first)._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
        }
      }
      pEVar13 = Var::operator!=(pVVar3,(Var *)auStack_98);
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &(pEVar13->super_Var).super_enable_shared_from_this<kratos::Var>);
      peVar6 = peStack_70;
      local_a0 = local_78;
      local_78 = (Var *)0x0;
      peStack_70 = (element_type *)0x0;
      if ((element_type *)local_38._M_nxt != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_nxt);
      }
      if (peStack_70 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_70);
      }
      if (ppVar4 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppVar4);
      }
      std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ::~vector((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                 *)auStack_58);
      local_38._M_nxt = (_Hash_node_base *)peVar6;
      if (or_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   or_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
LAB_00227536:
    sVar17 = get_cond((EnableStmtVisitor *)auStack_58,stmt_00);
    _Var14 = sVar17.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (auStack_58 == (undefined1  [8])0x0) {
      (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)local_a0;
      *(_Hash_node_base **)&(this->super_IRVisitor).level = local_38._M_nxt;
      local_38._M_nxt = (_Hash_node_base *)0x0;
    }
    else {
      pEVar13 = Var::operator&&(local_a0,(Var *)auStack_58);
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &(pEVar13->super_Var).super_enable_shared_from_this<kratos::Var>);
      _Var14._M_pi = extraout_RDX_00;
    }
    if (rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      _Var14._M_pi = extraout_RDX_01;
    }
  }
  else {
    if (stmt_00->type_ == If) {
      if (*(Stmt **)&stmt_00[1].super_IRNode.verilog_ln == stmt) {
        local_a0 = (Var *)stmt_00[1].super_IRNode._vptr_IRNode;
        local_38._M_nxt =
             (_Hash_node_base *)
             stmt_00[1].super_IRNode.fn_name_ln.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if ((element_type *)local_38._M_nxt != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pvVar2 = &(((element_type *)local_38._M_nxt)->super_IRNode).fn_name_ln;
            *(int *)&(pvVar2->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar2->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
            UNLOCK();
          }
          else {
            pvVar2 = &(((element_type *)local_38._M_nxt)->super_IRNode).fn_name_ln;
            *(int *)&(pvVar2->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar2->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
      }
      else {
        pVVar3 = (Var *)stmt_00[1].super_IRNode._vptr_IRNode;
        ppVar4 = stmt_00[1].super_IRNode.fn_name_ln.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (ppVar4 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &(ppVar4->first)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &(ppVar4->first)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        pEVar13 = Var::r_not(pVVar3);
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                  ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_58,
                   (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                   &(pEVar13->super_Var).super_enable_shared_from_this<kratos::Var>);
        local_38._M_nxt =
             (_Hash_node_base *)
             rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_a0 = (Var *)auStack_58;
        rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        auStack_58 = (undefined1  [8])0x0;
        if (ppVar4 != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppVar4);
        }
      }
      goto LAB_00227536;
    }
    sVar17 = get_cond(this,stmt_00);
    _Var14 = sVar17.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_38._M_nxt = (_Hash_node_base *)0x0;
  }
  if ((element_type *)local_38._M_nxt != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_nxt);
    _Var14._M_pi = extraout_RDX_02;
  }
LAB_00227589:
  sVar17.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var14._M_pi;
  sVar17.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Var>)sVar17.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static std::shared_ptr<Var> get_cond(Stmt* stmt) {
        auto* ir_parent = stmt->parent();
        if (ir_parent->ir_node_kind() == IRNodeKind::GeneratorKind) {
            return nullptr;
        }
        auto* parent_stmt = reinterpret_cast<Stmt*>(ir_parent);
        std::shared_ptr<Var> expr;
        if (parent_stmt->type() == StatementType::If) {
            // need to figure out which block it belongs to
            auto* if_ = reinterpret_cast<IfStmt*>(parent_stmt);
            if (if_->then_body().get() == stmt) {
                expr = if_->predicate();
            } else {
                expr = if_->predicate()->r_not().shared_from_this();
            }
        } else if (parent_stmt->type() == StatementType::Switch) {
            auto* switch_ = reinterpret_cast<SwitchStmt*>(parent_stmt);
            // figure out which condition it is in. notice that we could be in the default
            // branch as well
            auto const& body = switch_->body();
            bool found = false;
            for (auto const& [cond, stmt_blk] : body) {
                if (stmt_blk.get() == stmt) {
                    // it's this condition
                    if (cond) expr = switch_->target()->eq(*cond).shared_from_this();
                    found = true;
                    break;
                }
            }
            if (!found) {
                throw StmtException("Incorrect statement block stage", {stmt});
            }
            if (!expr) {
                // it's the default one. we nor them together
                std::shared_ptr<Var> or_;
                std::vector<std::shared_ptr<Const>> conditions;
                conditions.reserve(body.size());
                for (auto const& [cond, stmt_blk] : body) {
                    if (cond) conditions.emplace_back(cond);
                }
                // sort conditions based on the value. it's guarantee to be unique
                // so no problems of overlap
                std::sort(
                    conditions.begin(), conditions.end(),
                    [](const std::shared_ptr<Const>& left, const std::shared_ptr<Const>& right) {
                        return left->value() < right->value();
                    });
                or_ = conditions[0];
                if (conditions.size() > 1) {
                    for (uint64_t i = 1; i < conditions.size(); i++) {
                        or_ = or_->operator||(*conditions[i]).shared_from_this();
                    }
                }
                expr = (switch_->target()->operator!=(*or_)).shared_from_this();
            }
        } else {
            return get_cond(parent_stmt);
        }
        auto rest_expr = get_cond(parent_stmt);
        if (rest_expr) {
            return expr->operator&&(*rest_expr).shared_from_this();
        } else {
            return expr;
        }
    }